

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall
google::protobuf::SourceCodeInfo_Location::ByteSizeLong(SourceCodeInfo_Location *this)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  __int_type_conflict value;
  __int_type_conflict value_00;
  ulong uVar6;
  
  sVar2 = internal::WireFormatLite::Int32Size(&this->path_);
  value_00 = 0;
  if (sVar2 == 0) {
    value = 0;
    lVar5 = 0;
  }
  else {
    value = (__int_type_conflict)sVar2;
    sVar3 = io::CodedOutputStream::VarintSize32SignExtended(value);
    lVar5 = sVar3 + 1;
  }
  (this->_path_cached_byte_size_).super___atomic_base<int>._M_i = value;
  lVar5 = lVar5 + sVar2;
  sVar2 = internal::WireFormatLite::Int32Size(&this->span_);
  if (sVar2 != 0) {
    value_00 = (__int_type_conflict)sVar2;
    sVar3 = io::CodedOutputStream::VarintSize32SignExtended(value_00);
    lVar5 = lVar5 + sVar3 + 1;
  }
  (this->_span_cached_byte_size_).super___atomic_base<int>._M_i = value_00;
  uVar1 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
  sVar2 = lVar5 + sVar2 + (ulong)uVar1;
  uVar6 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    sVar3 = internal::WireFormatLite::StringSize
                      ((string *)
                       ((this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_)->
                       elements[uVar6]);
    sVar2 = sVar2 + sVar3;
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->leading_comments_).ptr_);
      sVar2 = sVar2 + sVar3 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->trailing_comments_).ptr_);
      sVar2 = sVar2 + sVar3 + 1;
    }
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict)sVar2;
    return sVar2;
  }
  sVar2 = internal::ComputeUnknownFieldsSize(&this->_internal_metadata_,sVar2,&this->_cached_size_);
  return sVar2;
}

Assistant:

size_t SourceCodeInfo_Location::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.SourceCodeInfo.Location)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      Int32Size(this->path_);
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<::PROTOBUF_NAMESPACE_ID::int32>(data_size));
    }
    int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(data_size);
    _path_cached_byte_size_.store(cached_size,
                                    std::memory_order_relaxed);
    total_size += data_size;
  }

  // repeated int32 span = 2 [packed = true];
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      Int32Size(this->span_);
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<::PROTOBUF_NAMESPACE_ID::int32>(data_size));
    }
    int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(data_size);
    _span_cached_byte_size_.store(cached_size,
                                    std::memory_order_relaxed);
    total_size += data_size;
  }

  // repeated string leading_detached_comments = 6;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(leading_detached_comments_.size());
  for (int i = 0, n = leading_detached_comments_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      leading_detached_comments_.Get(i));
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional string leading_comments = 3;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_leading_comments());
    }

    // optional string trailing_comments = 4;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_trailing_comments());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}